

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_33(QPDF *pdf,char *arg2)

{
  FILE *__s;
  void *__ptr;
  size_t __size;
  QPDFWriter w;
  shared_ptr<Buffer> b;
  Pl_Buffer p;
  QPDFWriter aQStack_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  Pl_Buffer local_48 [56];
  
  Pl_Buffer::Pl_Buffer(local_48,"buffer",(Pipeline *)0x0);
  QPDFWriter::QPDFWriter(aQStack_68,pdf);
  QPDFWriter::setStaticID(SUB81(aQStack_68,0));
  QPDFWriter::setOutputPipeline((Pipeline *)aQStack_68);
  QPDFWriter::write();
  Pl_Buffer::getBufferSharedPointer();
  __s = (FILE *)QUtil::safe_fopen("a.pdf","wb");
  __ptr = (void *)Buffer::getBuffer();
  __size = Buffer::getSize();
  fwrite(__ptr,__size,1,__s);
  fclose(__s);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  Pl_Buffer::~Pl_Buffer(local_48);
  return;
}

Assistant:

static void
test_33(QPDF& pdf, char const* arg2)
{
    // Test writing to a custom pipeline
    Pl_Buffer p("buffer");
    QPDFWriter w(pdf);
    w.setStaticID(true);
    w.setOutputPipeline(&p);
    w.write();
    auto b = p.getBufferSharedPointer();
    FILE* f = QUtil::safe_fopen("a.pdf", "wb");
    fwrite(b->getBuffer(), b->getSize(), 1, f);
    fclose(f);
}